

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O0

LogLevel muduo::initLogLevel(void)

{
  char *pcVar1;
  LogLevel local_4;
  
  pcVar1 = getenv("MUDUO_LOG_TRACE");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = getenv("MUDUO_LOG_DEBUG");
    if (pcVar1 == (char *)0x0) {
      local_4 = INFO;
    }
    else {
      local_4 = DEBUG;
    }
  }
  else {
    local_4 = TRACE;
  }
  return local_4;
}

Assistant:

Logger::LogLevel initLogLevel()
{
  if (::getenv("MUDUO_LOG_TRACE"))
    return Logger::TRACE;
  else if (::getenv("MUDUO_LOG_DEBUG"))
    return Logger::DEBUG;
  else
    return Logger::INFO;
}